

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O1

bool EV_DoFloor(EFloor floortype,line_t_conflict *line,int tag,double speed,double height,int crush,
               int change,bool hexencrush,bool hereticlower)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  FSectorTagIterator local_48;
  double local_40;
  double local_38;
  
  if (tag == 0) {
    local_48.searchtag = -0x80000000;
    local_48.start = -1;
    if ((line != (line_t_conflict *)0x0) && (line->backsector != (sector_t_conflict *)0x0)) {
      local_48.start = (int)((ulong)((long)line->backsector - (long)sectors) >> 3) * 0x7a44c6b;
    }
  }
  else {
    local_48.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    local_48.searchtag = tag;
  }
  local_40 = speed;
  local_38 = height;
  uVar2 = FSectorTagIterator::Next(&local_48);
  bVar3 = false;
  while (-1 < (int)uVar2) {
    bVar1 = P_CreateFloor(sectors + uVar2,floortype,line,local_40,local_38,crush,change,hexencrush,
                          hereticlower);
    bVar3 = (bool)(bVar3 | bVar1);
    uVar2 = FSectorTagIterator::Next(&local_48);
  }
  return bVar3;
}

Assistant:

bool EV_DoFloor (DFloor::EFloor floortype, line_t *line, int tag,
				 double speed, double height, int crush, int change, bool hexencrush, bool hereticlower)
{
	int 		secnum;
	bool 		rtn = false;

	// check if a manual trigger; if so do just the sector on the backside
	FSectorTagIterator it(tag, line);
	while ((secnum = it.Next()) >= 0)
	{
		rtn |= P_CreateFloor(&sectors[secnum], floortype, line, speed, height, crush, change, hexencrush, hereticlower);
	}
	return rtn;
}